

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

void __thiscall ImgfsFile::imgfsheader::imgfsheader(imgfsheader *this,ReadWriter_ptr *rd)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  element_type *peVar4;
  ulong uVar5;
  ulong uVar6;
  uint32_t uVar7;
  undefined8 *puVar8;
  long lVar9;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  peVar4 = (rd->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar4->_vptr_ReadWriter[4])(peVar4,0x1c);
  uVar7 = ReadWriter::read32le
                    ((rd->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  this->direntsize = uVar7;
  uVar7 = ReadWriter::read32le
                    ((rd->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  this->chunksperblock = uVar7;
  uVar7 = ReadWriter::read32le
                    ((rd->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  this->bytesperblock = uVar7;
  ReadWriter::read32le((rd->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  uVar7 = ReadWriter::read32le
                    ((rd->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  this->compressiontype = uVar7;
  uVar7 = ReadWriter::read32le
                    ((rd->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  this->freesectorcount = uVar7;
  uVar7 = ReadWriter::read32le
                    ((rd->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  this->hiddensectorcount = uVar7;
  uVar1 = this->bytesperblock;
  uVar2 = this->direntsize;
  uVar3 = this->chunksperblock;
  uVar5 = (ulong)uVar1 / (ulong)uVar3;
  this->bytesperchunk = (uint32_t)uVar5;
  uVar6 = (ulong)(uVar1 - 8) / (ulong)uVar2;
  this->entriesperblock = (uint32_t)uVar6;
  if (uVar2 == 0x34) {
    if (g_verbose != 0) {
      local_50 = &local_40;
      local_48 = 0;
      local_40 = 0;
      for (lVar9 = 0; ((int)lVar9 != 4 && (*(char *)((long)&this->compressiontype + lVar9) != '\0'))
          ; lVar9 = lVar9 + 1) {
        std::__cxx11::string::push_back((char)&local_50);
      }
      printf("imgfshdr: dirent=%d, cpb=%d, bpb=%d bpc=%d, epb= %d, comp=%s free=%d, hidden=%d\n",
             0x34,(ulong)uVar3,(ulong)uVar1,uVar5,uVar6,local_50,(ulong)this->freesectorcount,
             (ulong)this->hiddensectorcount);
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
    }
    return;
  }
  puVar8 = (undefined8 *)__cxa_allocate_exception(8,(ulong)uVar3,(ulong)(uVar1 - 8) % (ulong)uVar2);
  *puVar8 = "unsupported direntsize";
  __cxa_throw(puVar8,&char_const*::typeinfo,0);
}

Assistant:

imgfsheader(ReadWriter_ptr rd)
        {
            // 00: f8 ac 2c 9d e3 d4 2b 4d bd 30 91 6e d8 4f 31 dc

            // 0x10 : 1
            // 0x14 : 1
            // 0x18 : 1
            rd->setpos(0x1c);
            direntsize= rd->read32le(); // 0x1c : 0x34
            chunksperblock= rd->read32le(); // 0x20 : 0x20
            bytesperblock= rd->read32le(); // 0x24 : 0x800
            rd->read32le(); // 0x28 : 0x1000
            compressiontype= rd->read32le(); // 0x2c
            freesectorcount= rd->read32le(); // 0x30
            hiddensectorcount= rd->read32le(); // 0x34 : 0x40

            bytesperchunk= bytesperblock/chunksperblock;
            entriesperblock= (bytesperblock-8)/direntsize;
            if (direntsize!=0x34)
                throw "unsupported direntsize";

            if (g_verbose) { 
                printf("imgfshdr: dirent=%d, cpb=%d, bpb=%d bpc=%d, epb= %d, comp=%s free=%d, hidden=%d\n", 
                    direntsize, chunksperblock, bytesperblock, bytesperchunk, entriesperblock, getstr((const uint8_t*)&compressiontype, 4).c_str(), freesectorcount, hiddensectorcount);
            }
        }